

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureTestUtil.cpp
# Opt level: O3

void __thiscall
deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
          (TextureRenderer *this,int texUnit,float *texCoord,TextureType texType)

{
  RenderParams local_44;
  
  local_44.samplerType = SAMPLERTYPE_FLOAT;
  local_44.flags = 0;
  local_44.w.m_data[0] = 1.0;
  local_44.w.m_data[1] = 1.0;
  local_44.w.m_data[2] = 1.0;
  local_44.w.m_data[3] = 1.0;
  local_44.bias = 0.0;
  local_44.ref = 0.0;
  local_44.colorScale.m_data[0] = 1.0;
  local_44.colorScale.m_data[1] = 1.0;
  local_44.colorScale.m_data[2] = 1.0;
  local_44.colorScale.m_data[3] = 1.0;
  local_44.colorBias.m_data[0] = 0.0;
  local_44.colorBias.m_data[1] = 0.0;
  local_44.colorBias.m_data[2] = 0.0;
  local_44.colorBias.m_data[3] = 0.0;
  local_44.texType = texType;
  renderQuad(this,texUnit,texCoord,&local_44);
  return;
}

Assistant:

void TextureRenderer::renderQuad (int texUnit, const float* texCoord, TextureType texType)
{
	renderQuad(texUnit, texCoord, RenderParams(texType));
}